

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

int __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorIncompatibleTarget::init
          (TransformFeedbackOverflowQueryErrorIncompatibleTarget *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  Functions *gl;
  TransformFeedbackOverflowQueryErrorIncompatibleTarget *this_local;
  long lVar4;
  
  TransformFeedbackOverflowQueryBaseTest::init((TransformFeedbackOverflowQueryBaseTest *)this,ctx);
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryErrorBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var_00,iVar2);
  (**(code **)(lVar4 + 0x6e0))(1,&this->m_incompatible_query);
  (**(code **)(lVar4 + 0x20))(0x8914,this->m_incompatible_query);
  (**(code **)(lVar4 + 0x628))(0x8914);
  (**(code **)(lVar4 + 0x6e0))(1,&this->m_overflow_query);
  (**(code **)(lVar4 + 0x20))(0x82ec,this->m_overflow_query);
  (**(code **)(lVar4 + 0x628))(0x82ec);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    (**(code **)(lVar4 + 0x6e0))(1,&this->m_stream_overflow_query);
    (**(code **)(lVar4 + 0x20))(0x82ed,this->m_stream_overflow_query);
    iVar2 = (**(code **)(lVar4 + 0x628))(0x82ed);
  }
  return iVar2;
}

Assistant:

virtual void init()
	{
		TransformFeedbackOverflowQueryErrorBase::init();

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.genQueries(1, &m_incompatible_query);
		gl.beginQuery(GL_SAMPLES_PASSED, m_incompatible_query);
		gl.endQuery(GL_SAMPLES_PASSED);

		gl.genQueries(1, &m_overflow_query);
		gl.beginQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, m_overflow_query);
		gl.endQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB);

		if (supportsTransformFeedback3())
		{
			gl.genQueries(1, &m_stream_overflow_query);
			gl.beginQuery(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, m_stream_overflow_query);
			gl.endQuery(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB);
		}
	}